

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O2

bool __thiscall Tag::getCloseTag(Tag *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"</");
  StreamObject::getName_abi_cxx11_(&local_1c0,&this->super_StreamObject);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
  std::operator<<(poVar2,">");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator!=(s,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return !bVar1;
}

Assistant:

bool Tag::getCloseTag( std::string &s )
{
	bool success = true;

	std::stringstream stream;

	stream << "</" << getName() << ">";

	if ( s != stream.str() )
	{
		//std::cerr << "Syntax error: \"</" << getName() << ">\" expected." << std::endl;
		success = false;
	}

	return success;
}